

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

void __thiscall
QItemDelegate::paint
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  uint uVar1;
  QAbstractItemModel *pQVar2;
  QIcon QVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  CheckState CVar7;
  QMetaType QVar8;
  undefined8 uVar9;
  State SVar10;
  QItemDelegate *this_00;
  QStyleOptionViewItem *option_00;
  anon_union_24_3_e3d07ef4_for_data *paVar11;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  long in_FS_OFFSET;
  QStyleOptionViewItem opt;
  QRect local_1b8;
  QRect local_1a8;
  QIcon local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  QRect local_178;
  undefined1 *local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  QStyleOptionViewItem local_148;
  InterfaceType *local_78 [3];
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(anon_union_24_3_e3d07ef4_for_data **)&(this->super_QAbstractItemDelegate).field_0x8;
  this_00 = (QItemDelegate *)0xaa;
  memset(&local_148,0xaa,0xd0);
  setOptions(&local_148,this_00,index,option);
  QPainter::save();
  if ((bool)this_01->data[0x80] == true) {
    QPainter::setClipRect((QRect *)painter,(int)&local_148 + 0x10);
  }
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_168);
  local_178.x1.m_i = -0x55555556;
  local_178.y1.m_i = -0x55555556;
  local_178.x2.m_i = -0x55555556;
  local_178.y2.m_i = -0x55555556;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_78[0] = (InterfaceType *)0x0;
    local_78[1] = (InterfaceType *)0x0;
    local_78[2] = (InterfaceType *)0x0;
    local_60._0_4_ = 2;
    local_60._4_4_ = 0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x90))(local_78,pQVar2,index,1);
  }
  option_00 = (QStyleOptionViewItem *)local_78;
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)local_78);
  ::QVariant::~QVariant((QVariant *)local_78);
  if (local_40 < (QObject *)0x4) {
    QIcon::QIcon(&local_198);
    QVar3.d = local_198.d;
    local_198.d = (QIconPrivate *)0x0;
    local_78[0] = (InterfaceType *)(((Icon *)(this_01->data + 0xa8))->icon).d;
    (((Icon *)(this_01->data + 0xa8))->icon).d = QVar3.d;
    QIcon::~QIcon((QIcon *)local_78);
    QIcon::~QIcon(&local_198);
    local_178.x2.m_i = -1;
    local_178.y2.m_i = -1;
  }
  else {
    paVar11 = &local_58;
    decoration((QItemDelegate *)&local_198,option_00,(QVariant *)&local_148);
    local_78[2] = (InterfaceType *)&DAT_aaaaaaaaaaaaaaaa;
    local_78[0] = (InterfaceType *)&DAT_aaaaaaaaaaaaaaaa;
    local_78[1] = (InterfaceType *)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_78);
    local_78[2] = (InterfaceType *)local_158;
    local_158 = local_188;
    local_78[0] = (InterfaceType *)QDataStream::operator<<;
    local_188 = (undefined1 *)0x0;
    QPixmap::~QPixmap((QPixmap *)local_78);
    QPixmap::~QPixmap((QPixmap *)&local_198);
    iVar6 = ::QVariant::typeId((QVariant *)paVar11);
    if (iVar6 == 0x1005) {
      local_78[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
      local_198.d = (QIconPrivate *)(local_40 & 0xfffffffffffffffc);
      bVar4 = comparesEqual((QMetaType *)&local_198,(QMetaType *)local_78);
      if (bVar4) {
        if ((local_40 & 1) == 0) {
          paVar11 = &local_58;
        }
        else {
          paVar11 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_58.shared + *(int *)(local_58.shared + 4));
        }
        QIcon::QIcon(&local_198,(QIcon *)&paVar11->shared);
      }
      else {
        local_198.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QIcon::QIcon(&local_198);
        QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((local_40 & 1) != 0) {
          paVar11 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_58.shared + *(int *)(local_58.shared + 4));
        }
        QMetaType::convert(QVar8,paVar11,(QMetaType)local_78[0],&local_198);
      }
      QVar3.d = local_198.d;
      local_198.d = (QIconPrivate *)0x0;
      local_78[0] = (InterfaceType *)(((Icon *)(this_01->data + 0xa8))->icon).d;
      (((Icon *)(this_01->data + 0xa8))->icon).d = QVar3.d;
      QIcon::~QIcon((QIcon *)local_78);
      QIcon::~QIcon(&local_198);
      uVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      SVar10 = Off;
      if ((uVar1 & 1) != 0) {
        SVar10 = (uint)(int)(short)uVar1 >> 0xf & 3;
      }
      *(State *)(this_01->data + 0xb0) = SVar10;
      *(uint *)(this_01->data + 0xb4) =
           (uint)(((option->super_QStyleOption).state.
                   super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i >> 0x12 & 1) == 0);
      uVar9 = QIcon::actualSize((QSize *)(this_01->data + 0xa8),(int)option + 0x50,SVar10);
    }
    else {
      QIcon::QIcon(&local_198);
      QVar3.d = local_198.d;
      local_198.d = (QIconPrivate *)0x0;
      local_78[0] = (InterfaceType *)(((Icon *)(this_01->data + 0xa8))->icon).d;
      (((Icon *)(this_01->data + 0xa8))->icon).d = QVar3.d;
      QIcon::~QIcon((QIcon *)local_78);
      QIcon::~QIcon(&local_198);
      uVar9 = QPixmap::size();
    }
    local_178.x2.m_i = (int)uVar9 + -1;
    local_178.y2.m_i = (int)((ulong)uVar9 >> 0x20) + -1;
  }
  local_178.x1.m_i = 0;
  local_178.y1.m_i = 0;
  local_1a8._0_12_ = ZEXT412(0xffffffff) << 0x40;
  local_1a8.y2.m_i = -1;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_78[0] = (InterfaceType *)0x0;
    local_78[1] = (InterfaceType *)0x0;
    local_78[2] = (InterfaceType *)0x0;
    local_60._0_4_ = 2;
    local_60._4_4_ = 0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x90))(local_78,pQVar2,index,10);
  }
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)local_78);
  ::QVariant::~QVariant((QVariant *)local_78);
  CVar7 = Unchecked;
  if ((QObject *)0x3 < local_40) {
    paVar11 = &local_58;
    CVar7 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>((QVariant *)&local_58);
    local_1a8 = doCheck((QItemDelegate *)paVar11,&local_148,&local_148.super_QStyleOption.rect,
                        (QVariant *)&local_58);
  }
  local_198.d = (QIconPrivate *)0x0;
  puStack_190 = (undefined1 *)0x0;
  local_188 = (undefined1 *)0x0;
  local_1b8._0_12_ = ZEXT412(0xffffffff) << 0x40;
  local_1b8.y2.m_i = -1;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_78[0] = (InterfaceType *)0x0;
    local_78[1] = (InterfaceType *)0x0;
    local_78[2] = (InterfaceType *)0x0;
    local_60._0_4_ = 2;
    local_60._4_4_ = 0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x90))(local_78,pQVar2,index,0);
  }
  paVar11 = (anon_union_24_3_e3d07ef4_for_data *)local_78;
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)paVar11);
  ::QVariant::~QVariant((QVariant *)paVar11);
  if ((QObject *)0x3 < local_40) {
    paVar11 = &local_58;
    cVar5 = ::QVariant::isNull();
    if (cVar5 == '\0') {
      QAbstractItemDelegatePrivate::textForRole
                ((QString *)local_78,(QAbstractItemDelegatePrivate *)this_01,DisplayRole,
                 (QVariant *)&local_58,&local_148.locale,10);
      local_198.d = (QIconPrivate *)local_78[0];
      puStack_190 = (undefined1 *)local_78[1];
      local_188 = (undefined1 *)local_78[2];
      local_1b8 = QItemDelegatePrivate::displayRect
                            ((QItemDelegatePrivate *)this_01,index,&local_148,&local_178,&local_1a8)
      ;
      paVar11 = this_01;
    }
  }
  doLayout((QItemDelegate *)paVar11,&local_148,&local_1a8,&local_178,&local_1b8,false);
  drawBackground((QItemDelegate *)paVar11,painter,&local_148,index);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 200))
            (this,painter,&local_148,&local_1a8,CVar7);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 0xb8))
            (this,painter,&local_148,&local_178,&local_168);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 0xb0))
            (this,painter,&local_148,&local_1b8,&local_198);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 0xc0))
            (this,painter,&local_148,&local_1b8);
  QPainter::restore();
  if ((InterfaceType *)local_198.d != (InterfaceType *)0x0) {
    LOCK();
    *(int *)local_198.d = *(int *)local_198.d + -1;
    UNLOCK();
    if (*(int *)local_198.d == 0) {
      QArrayData::deallocate((QArrayData *)local_198.d,2,0x10);
    }
  }
  QPixmap::~QPixmap((QPixmap *)&local_168);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QBrush::~QBrush(&local_148.backgroundBrush);
  if (&(local_148.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_148.icon);
  QLocale::~QLocale(&local_148.locale);
  QFont::~QFont(&local_148.font);
  QStyleOption::~QStyleOption(&local_148.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::paint(QPainter *painter,
                          const QStyleOptionViewItem &option,
                          const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    Q_ASSERT(index.isValid());

    QStyleOptionViewItem opt = setOptions(index, option);

    // prepare
    painter->save();
    if (d->clipPainting)
        painter->setClipRect(opt.rect);

    // get the data and the rectangles

    QVariant value;

    QPixmap pixmap;
    QRect decorationRect;
    value = index.data(Qt::DecorationRole);
    if (value.isValid()) {
        // ### we need the pixmap to call the virtual function
        pixmap = decoration(opt, value);
        if (value.userType() == QMetaType::QIcon) {
            d->tmp.icon = qvariant_cast<QIcon>(value);
            d->tmp.mode = d->iconMode(option.state);
            d->tmp.state = d->iconState(option.state);
            const QSize size = d->tmp.icon.actualSize(option.decorationSize,
                                                      d->tmp.mode, d->tmp.state);
            decorationRect = QRect(QPoint(0, 0), size);
        } else {
            d->tmp.icon = QIcon();
            decorationRect = QRect(QPoint(0, 0), pixmap.size());
        }
    } else {
        d->tmp.icon = QIcon();
        decorationRect = QRect();
    }

    QRect checkRect;
    Qt::CheckState checkState = Qt::Unchecked;
    value = index.data(Qt::CheckStateRole);
    if (value.isValid()) {
        checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(value);
        checkRect = doCheck(opt, opt.rect, value);
    }

    QString text;
    QRect displayRect;
    value = index.data(Qt::DisplayRole);
    if (value.isValid() && !value.isNull()) {
        text = d->valueToText(value, opt);
        displayRect = d->displayRect(index, opt, decorationRect, checkRect);
    }

    // do the layout

    doLayout(opt, &checkRect, &decorationRect, &displayRect, false);

    // draw the item

    drawBackground(painter, opt, index);
    drawCheck(painter, opt, checkRect, checkState);
    drawDecoration(painter, opt, decorationRect, pixmap);
    drawDisplay(painter, opt, displayRect, text);
    drawFocus(painter, opt, displayRect);

    // done
    painter->restore();
}